

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O2

void __thiscall dbwrapper_tests::dbwrapper_basic_data::test_method(dbwrapper_basic_data *this)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key;
  uint64_t uVar4;
  long lVar5;
  char *p2;
  iterator in_R8;
  iterator pvVar6;
  string *psVar7;
  bool *in_R9;
  iterator pvVar8;
  string *psVar9;
  uint32_t *puVar10;
  bool *pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  FastRandomContext *this_00;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  bool *in_stack_fffffffffffff7f0;
  string *psVar12;
  uint32_t *puVar13;
  bool *pbVar14;
  uint256 *puVar15;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  lazy_ostream local_760;
  undefined1 *local_750;
  char **local_748;
  assertion_result local_740;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  bool in_file_bool;
  uint8_t filename_length;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  uint8_t key_lastblockhash_uxto;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  bool isInReindexing;
  uint8_t key_IsReindexing;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  uint32_t lastblockfilenumber;
  uint8_t key_last_blockfile_number;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  bool res_bool;
  uint32_t res_uint_32;
  char local_2ba [2];
  string key_file_option;
  string filename;
  string file_option_tag;
  uint256 lastblock_hash;
  uint256 in_utxo;
  string key_utxo;
  uint256 in_transaction;
  string key_transaction;
  uint256 in_file_info;
  string key_file;
  uint256 in_block;
  string key_block;
  uint256 res;
  CDBWrapper dbw;
  path local_88;
  path ph;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_2ba[0] = '\0';
  local_2ba[1] = '\x01';
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 2) break;
    cVar1 = local_2ba[lVar5];
    ArgsManager::GetDataDirBase
              ((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
    p2 = "dbwrapper_1_obfuscate_false";
    if (cVar1 != '\0') {
      p2 = "dbwrapper_1_obfuscate_true";
    }
    fs::operator/((path *)&ph.super_path,(path *)&local_88,p2);
    std::filesystem::__cxx11::path::~path(&local_88);
    std::filesystem::__cxx11::path::path((path *)&res,&ph.super_path);
    CDBWrapper::CDBWrapper(&dbw,(DBParams *)&res);
    std::filesystem::__cxx11::path::~path((path *)&res);
    res.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_2d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_2d0 = "";
    local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x3c;
    file.m_begin = (iterator)&local_2d8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2e8,msg);
    key = dbwrapper_private::GetObfuscateKey(&dbw);
    bVar3 = is_null_key(key);
    in_block.super_base_blob<256U>.m_data._M_elems[0] = (bool)cVar1 != bVar3;
    in_block.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_file._M_dataplus._M_p = "obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw))";
    key_file._M_string_length =
         (long)"obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw))" + 0x41;
    key_block._M_string_length._0_1_ = 0;
    key_block._M_dataplus._M_p = "<W\x1b";
    key_block.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_2f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_2f0 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    key_block.field_2._8_8_ = &key_file;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&in_block,(lazy_ostream *)&key_block,1,0,WARN,
               (check_type)in_stack_fffffffffffff7f0,(size_t)&local_2f8,0x3c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(in_block.super_base_blob<256U>.m_data._M_elems + 0x10));
    RandomMixin<FastRandomContext>::rand256
              ((uint256 *)&key_file,&this_00->super_RandomMixin<FastRandomContext>);
    base_blob<256u>::ToString_abi_cxx11_((string *)&in_block,(base_blob<256u> *)&key_file);
    std::operator+(&key_block,"b",(string *)&in_block);
    std::__cxx11::string::~string((string *)&in_block);
    RandomMixin<FastRandomContext>::rand256
              (&in_block,&this_00->super_RandomMixin<FastRandomContext>);
    local_308 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_300 = "";
    local_318 = &boost::unit_test::basic_cstring<char_const>::null;
    local_310 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar8;
    msg_00.m_begin = pvVar6;
    file_00.m_end = (iterator)0x42;
    file_00.m_begin = (iterator)&local_308;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_318,
               msg_00);
    bVar3 = CDBWrapper::Write<std::__cxx11::string,uint256>(&dbw,&key_block,&in_block,false);
    in_file_info.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_transaction._M_dataplus._M_p = "dbw.Write(key_block, in_block)";
    key_transaction._M_string_length = (long)"dbw.Write(key_block, in_block)" + 0x1e;
    key_file._M_string_length = key_file._M_string_length & 0xffffffffffffff00;
    key_file._M_dataplus._M_p = "<W\x1b";
    key_file.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    key_file.field_2._8_8_ = &key_transaction;
    local_328 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_320 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    in_file_info.super_base_blob<256U>.m_data._M_elems[0] = bVar3;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&in_file_info,(lazy_ostream *)&key_file,1,0,WARN,
               (check_type)in_stack_fffffffffffff7f0,(size_t)&local_328,0x42);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(in_file_info.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_338 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_330 = "";
    local_348 = &boost::unit_test::basic_cstring<char_const>::null;
    local_340 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar8;
    msg_01.m_begin = pvVar6;
    file_01.m_end = (iterator)0x43;
    file_01.m_begin = (iterator)&local_338;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_348,
               msg_01);
    in_file_info.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Read<std::__cxx11::string,uint256>(&dbw,&key_block,&res);
    in_file_info.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_transaction._M_dataplus._M_p = "dbw.Read(key_block, res)";
    key_transaction._M_string_length = (long)"dbw.Read(key_block, res)" + 0x18;
    key_file._M_string_length = key_file._M_string_length & 0xffffffffffffff00;
    key_file._M_dataplus._M_p = "<W\x1b";
    key_file.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    key_file.field_2._8_8_ = &key_transaction;
    local_358 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_350 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&in_file_info,(lazy_ostream *)&key_file,1,0,WARN,
               (check_type)in_stack_fffffffffffff7f0,(size_t)&local_358,0x43);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(in_file_info.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_368 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_360 = "";
    local_378 = &boost::unit_test::basic_cstring<char_const>::null;
    local_370 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = pvVar8;
    msg_02.m_begin = pvVar6;
    file_02.m_end = (iterator)0x44;
    file_02.m_begin = (iterator)&local_368;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_378,
               msg_02);
    key_file._M_string_length = key_file._M_string_length & 0xffffffffffffff00;
    key_file._M_dataplus._M_p = "<W\x1b";
    key_file.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    key_file.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_388 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_380 = "";
    base_blob<256u>::ToString_abi_cxx11_((string *)&in_file_info,(base_blob<256u> *)&res);
    base_blob<256u>::ToString_abi_cxx11_(&key_transaction,(base_blob<256u> *)&in_block);
    pvVar6 = (iterator)0x2;
    psVar9 = (string *)&in_file_info;
    psVar7 = &key_transaction;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&key_file,&local_388,0x44,1,2,(string *)&in_file_info,"res.ToString()",
               &key_transaction,"in_block.ToString()");
    std::__cxx11::string::~string((string *)&key_transaction);
    std::__cxx11::string::~string((string *)&in_file_info);
    uVar4 = RandomMixin<FastRandomContext>::randbits<32>
                      (&this_00->super_RandomMixin<FastRandomContext>);
    in_file_info.super_base_blob<256U>.m_data._M_elems._0_4_ = SUB84(uVar4,0);
    tinyformat::format<unsigned_int>(&key_file,"f%04x",(uint *)&in_file_info);
    RandomMixin<FastRandomContext>::rand256
              (&in_file_info,&this_00->super_RandomMixin<FastRandomContext>);
    local_398 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_390 = "";
    local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = (iterator)psVar9;
    msg_03.m_begin = pvVar6;
    file_03.m_end = (iterator)0x4a;
    file_03.m_begin = (iterator)&local_398;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3a8,
               msg_03);
    in_transaction.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Write<std::__cxx11::string,uint256>(&dbw,&key_file,&in_file_info,false);
    in_transaction.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_utxo._M_dataplus._M_p = "dbw.Write(key_file, in_file_info)";
    key_utxo._M_string_length = (long)"dbw.Write(key_file, in_file_info)" + 0x21;
    key_transaction._M_string_length = key_transaction._M_string_length & 0xffffffffffffff00;
    key_transaction._M_dataplus._M_p = "<W\x1b";
    key_transaction.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    key_transaction.field_2._8_8_ = &key_utxo;
    local_3b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_3b0 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&in_transaction,(lazy_ostream *)&key_transaction,1,0,WARN,
               (check_type)psVar7,(size_t)&local_3b8,0x4a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(in_transaction.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_3c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_3c0 = "";
    local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = pvVar8;
    msg_04.m_begin = pvVar6;
    file_04.m_end = (iterator)0x4b;
    file_04.m_begin = (iterator)&local_3c8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3d8,
               msg_04);
    in_transaction.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Read<std::__cxx11::string,uint256>(&dbw,&key_file,&res);
    in_transaction.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_utxo._M_dataplus._M_p = "dbw.Read(key_file, res)";
    key_utxo._M_string_length = (long)"dbw.Read(key_file, res)" + 0x17;
    key_transaction._M_string_length = key_transaction._M_string_length & 0xffffffffffffff00;
    key_transaction._M_dataplus._M_p = "<W\x1b";
    key_transaction.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    key_transaction.field_2._8_8_ = &key_utxo;
    local_3e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_3e0 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&in_transaction,(lazy_ostream *)&key_transaction,1,0,WARN,
               (check_type)psVar7,(size_t)&local_3e8,0x4b);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(in_transaction.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_3f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_3f0 = "";
    local_408 = &boost::unit_test::basic_cstring<char_const>::null;
    local_400 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar8;
    msg_05.m_begin = pvVar6;
    file_05.m_end = (iterator)0x4c;
    file_05.m_begin = (iterator)&local_3f8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_408,
               msg_05);
    key_transaction._M_string_length = key_transaction._M_string_length & 0xffffffffffffff00;
    key_transaction._M_dataplus._M_p = "<W\x1b";
    key_transaction.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    key_transaction.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_418 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_410 = "";
    base_blob<256u>::ToString_abi_cxx11_((string *)&in_transaction,(base_blob<256u> *)&res);
    base_blob<256u>::ToString_abi_cxx11_(&key_utxo,(base_blob<256u> *)&in_file_info);
    pvVar6 = (iterator)0x2;
    psVar7 = (string *)&in_transaction;
    psVar12 = &key_utxo;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&key_transaction,&local_418,0x4c,1,2,(string *)&in_transaction,"res.ToString()",
               &key_utxo,"in_file_info.ToString()");
    std::__cxx11::string::~string((string *)&key_utxo);
    std::__cxx11::string::~string((string *)&in_transaction);
    RandomMixin<FastRandomContext>::rand256
              ((uint256 *)&key_utxo,&this_00->super_RandomMixin<FastRandomContext>);
    base_blob<256u>::ToString_abi_cxx11_((string *)&in_transaction,(base_blob<256u> *)&key_utxo);
    std::operator+(&key_transaction,"t",(string *)&in_transaction);
    std::__cxx11::string::~string((string *)&in_transaction);
    RandomMixin<FastRandomContext>::rand256
              (&in_transaction,&this_00->super_RandomMixin<FastRandomContext>);
    local_428 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_420 = "";
    local_438 = &boost::unit_test::basic_cstring<char_const>::null;
    local_430 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = (iterator)psVar7;
    msg_06.m_begin = pvVar6;
    file_06.m_end = (iterator)0x52;
    file_06.m_begin = (iterator)&local_428;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_438,
               msg_06);
    in_utxo.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Write<std::__cxx11::string,uint256>
                   (&dbw,&key_transaction,&in_transaction,false);
    in_utxo.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_5b6d94;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"dbw.Write(key_transaction, in_transaction)" + 0x2a;
    key_utxo._M_string_length = key_utxo._M_string_length & 0xffffffffffffff00;
    key_utxo._M_dataplus._M_p = "<W\x1b";
    key_utxo.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_448 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_440 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    key_utxo.field_2._8_8_ = &lastblock_hash;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&in_utxo,(lazy_ostream *)&key_utxo,1,0,WARN,(check_type)psVar12,
               (size_t)&local_448,0x52);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(in_utxo.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_458 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_450 = "";
    local_468 = &boost::unit_test::basic_cstring<char_const>::null;
    local_460 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = pvVar8;
    msg_07.m_begin = pvVar6;
    file_07.m_end = (iterator)0x53;
    file_07.m_begin = (iterator)&local_458;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_468,
               msg_07);
    in_utxo.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Read<std::__cxx11::string,uint256>(&dbw,&key_transaction,&res);
    in_utxo.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_5b6dad;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"dbw.Read(key_transaction, res)" + 0x1e;
    key_utxo._M_string_length = key_utxo._M_string_length & 0xffffffffffffff00;
    key_utxo._M_dataplus._M_p = "<W\x1b";
    key_utxo.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_478 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_470 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    key_utxo.field_2._8_8_ = &lastblock_hash;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&in_utxo,(lazy_ostream *)&key_utxo,1,0,WARN,(check_type)psVar12,
               (size_t)&local_478,0x53);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(in_utxo.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_488 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_480 = "";
    local_498 = &boost::unit_test::basic_cstring<char_const>::null;
    local_490 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_08.m_end = pvVar8;
    msg_08.m_begin = pvVar6;
    file_08.m_end = (iterator)0x54;
    file_08.m_begin = (iterator)&local_488;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_498,
               msg_08);
    key_utxo._M_string_length = key_utxo._M_string_length & 0xffffffffffffff00;
    key_utxo._M_dataplus._M_p = "<W\x1b";
    key_utxo.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    key_utxo.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_4a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_4a0 = "";
    base_blob<256u>::ToString_abi_cxx11_((string *)&in_utxo,(base_blob<256u> *)&res);
    base_blob<256u>::ToString_abi_cxx11_
              ((string *)&lastblock_hash,(base_blob<256u> *)&in_transaction);
    pvVar6 = (iterator)0x2;
    psVar7 = (string *)&in_utxo;
    psVar12 = (string *)&lastblock_hash;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&key_utxo,&local_4a8,0x54,1,2,(string *)&in_utxo,"res.ToString()",
               (string *)&lastblock_hash,"in_transaction.ToString()");
    std::__cxx11::string::~string((string *)&lastblock_hash);
    std::__cxx11::string::~string((string *)&in_utxo);
    RandomMixin<FastRandomContext>::rand256
              (&lastblock_hash,&this_00->super_RandomMixin<FastRandomContext>);
    base_blob<256u>::ToString_abi_cxx11_((string *)&in_utxo,(base_blob<256u> *)&lastblock_hash);
    std::operator+(&key_utxo,"c",(string *)&in_utxo);
    std::__cxx11::string::~string((string *)&in_utxo);
    RandomMixin<FastRandomContext>::rand256(&in_utxo,&this_00->super_RandomMixin<FastRandomContext>)
    ;
    local_4b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_4b0 = "";
    local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = (iterator)psVar7;
    msg_09.m_begin = pvVar6;
    file_09.m_end = (iterator)0x5a;
    file_09.m_begin = (iterator)&local_4b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4c8,
               msg_09);
    bVar3 = CDBWrapper::Write<std::__cxx11::string,uint256>(&dbw,&key_utxo,&in_utxo,false);
    file_option_tag._M_dataplus._M_p._0_1_ = bVar3;
    file_option_tag._M_string_length = 0;
    file_option_tag.field_2._M_allocated_capacity = 0;
    filename._M_dataplus._M_p = "dbw.Write(key_utxo, in_utxo)";
    filename._M_string_length = (long)"dbw.Write(key_utxo, in_utxo)" + 0x1c;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &filename;
    local_4d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_4d0 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&file_option_tag,(lazy_ostream *)&lastblock_hash,1,0,WARN,
               (check_type)psVar12,(size_t)&local_4d8,0x5a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&file_option_tag.field_2._M_allocated_capacity);
    local_4e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_4e0 = "";
    local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_10.m_end = pvVar8;
    msg_10.m_begin = pvVar6;
    file_10.m_end = (iterator)0x5b;
    file_10.m_begin = (iterator)&local_4e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4f8,
               msg_10);
    bVar3 = CDBWrapper::Read<std::__cxx11::string,uint256>(&dbw,&key_utxo,&res);
    file_option_tag._M_dataplus._M_p._0_1_ = bVar3;
    file_option_tag._M_string_length = 0;
    file_option_tag.field_2._M_allocated_capacity = 0;
    filename._M_dataplus._M_p = "dbw.Read(key_utxo, res)";
    filename._M_string_length = (long)"dbw.Read(key_utxo, res)" + 0x17;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &filename;
    local_508 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_500 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&file_option_tag,(lazy_ostream *)&lastblock_hash,1,0,WARN,
               (check_type)psVar12,(size_t)&local_508,0x5b);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&file_option_tag.field_2._M_allocated_capacity);
    local_518 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_510 = "";
    local_528 = &boost::unit_test::basic_cstring<char_const>::null;
    local_520 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_11.m_end = pvVar8;
    msg_11.m_begin = pvVar6;
    file_11.m_end = (iterator)0x5c;
    file_11.m_begin = (iterator)&local_518;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_528,
               msg_11);
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_538 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_530 = "";
    base_blob<256u>::ToString_abi_cxx11_(&file_option_tag,(base_blob<256u> *)&res);
    base_blob<256u>::ToString_abi_cxx11_(&filename,(base_blob<256u> *)&in_utxo);
    pvVar6 = (iterator)0x2;
    psVar7 = &file_option_tag;
    psVar12 = &filename;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&lastblock_hash,&local_538,0x5c,1,2,&file_option_tag,"res.ToString()",&filename,
               "in_utxo.ToString()");
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&file_option_tag);
    key_last_blockfile_number = 'l';
    uVar4 = RandomMixin<FastRandomContext>::randbits<32>
                      (&this_00->super_RandomMixin<FastRandomContext>);
    lastblockfilenumber = (uint32_t)uVar4;
    local_550 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_548 = "";
    local_560 = &boost::unit_test::basic_cstring<char_const>::null;
    local_558 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_12.m_end = (iterator)psVar7;
    msg_12.m_begin = pvVar6;
    file_12.m_end = (iterator)0x61;
    file_12.m_begin = (iterator)&local_550;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_560,
               msg_12);
    bVar3 = CDBWrapper::Write<unsigned_char,unsigned_int>
                      (&dbw,&key_last_blockfile_number,&lastblockfilenumber,false);
    file_option_tag._M_dataplus._M_p._0_1_ = bVar3;
    file_option_tag._M_string_length = 0;
    file_option_tag.field_2._M_allocated_capacity = 0;
    filename._M_dataplus._M_p = "dbw.Write(key_last_blockfile_number, lastblockfilenumber)";
    filename._M_string_length =
         (long)"dbw.Write(key_last_blockfile_number, lastblockfilenumber)" + 0x39;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &filename;
    local_570 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_568 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&file_option_tag,(lazy_ostream *)&lastblock_hash,1,0,WARN,
               (check_type)psVar12,(size_t)&local_570,0x61);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&file_option_tag.field_2._M_allocated_capacity);
    local_580 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_578 = "";
    local_590 = &boost::unit_test::basic_cstring<char_const>::null;
    local_588 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_13.m_end = pvVar8;
    msg_13.m_begin = pvVar6;
    file_13.m_end = (iterator)0x62;
    file_13.m_begin = (iterator)&local_580;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_590,
               msg_13);
    bVar3 = CDBWrapper::Read<unsigned_char,unsigned_int>
                      (&dbw,&key_last_blockfile_number,&res_uint_32);
    file_option_tag._M_dataplus._M_p._0_1_ = bVar3;
    file_option_tag._M_string_length = 0;
    file_option_tag.field_2._M_allocated_capacity = 0;
    filename._M_dataplus._M_p = "dbw.Read(key_last_blockfile_number, res_uint_32)";
    filename._M_string_length = (long)"dbw.Read(key_last_blockfile_number, res_uint_32)" + 0x30;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &filename;
    local_5a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_598 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&file_option_tag,(lazy_ostream *)&lastblock_hash,1,0,WARN,
               (check_type)psVar12,(size_t)&local_5a0,0x62);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&file_option_tag.field_2._M_allocated_capacity);
    local_5b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_5a8 = "";
    local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_14.m_end = pvVar8;
    msg_14.m_begin = pvVar6;
    file_14.m_end = (iterator)0x63;
    file_14.m_begin = (iterator)&local_5b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5c0,
               msg_14);
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_5d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_5c8 = "";
    puVar13 = &res_uint_32;
    pvVar6 = (iterator)0x2;
    puVar10 = &lastblockfilenumber;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&lastblock_hash,&local_5d0,99,1,2,puVar10,"lastblockfilenumber",puVar13,"res_uint_32"
              );
    key_IsReindexing = 'R';
    isInReindexing =
         RandomMixin<FastRandomContext>::randbool(&this_00->super_RandomMixin<FastRandomContext>);
    local_5e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_5e0 = "";
    local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_15.m_end = (iterator)puVar10;
    msg_15.m_begin = pvVar6;
    file_15.m_end = &DAT_00000068;
    file_15.m_begin = (iterator)&local_5e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_5f8,
               msg_15);
    bVar3 = CDBWrapper::Write<unsigned_char,bool>(&dbw,&key_IsReindexing,&isInReindexing,false);
    file_option_tag._M_dataplus._M_p._0_1_ = bVar3;
    file_option_tag._M_string_length = 0;
    file_option_tag.field_2._M_allocated_capacity = 0;
    filename._M_dataplus._M_p = "dbw.Write(key_IsReindexing, isInReindexing)";
    filename._M_string_length = (long)"dbw.Write(key_IsReindexing, isInReindexing)" + 0x2b;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &filename;
    local_608 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_600 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&file_option_tag,(lazy_ostream *)&lastblock_hash,1,0,WARN,
               (check_type)puVar13,(size_t)&local_608,0x68);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&file_option_tag.field_2._M_allocated_capacity);
    local_618 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_610 = "";
    local_628 = &boost::unit_test::basic_cstring<char_const>::null;
    local_620 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_16.m_end = pvVar8;
    msg_16.m_begin = pvVar6;
    file_16.m_end = (iterator)0x69;
    file_16.m_begin = (iterator)&local_618;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_628,
               msg_16);
    bVar3 = CDBWrapper::Read<unsigned_char,bool>(&dbw,&key_IsReindexing,&res_bool);
    file_option_tag._M_dataplus._M_p._0_1_ = bVar3;
    file_option_tag._M_string_length = 0;
    file_option_tag.field_2._M_allocated_capacity = 0;
    filename._M_dataplus._M_p = "dbw.Read(key_IsReindexing, res_bool)";
    filename._M_string_length = (long)"dbw.Read(key_IsReindexing, res_bool)" + 0x24;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &filename;
    local_638 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_630 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&file_option_tag,(lazy_ostream *)&lastblock_hash,1,0,WARN,
               (check_type)puVar13,(size_t)&local_638,0x69);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&file_option_tag.field_2._M_allocated_capacity);
    local_648 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_640 = "";
    local_658 = &boost::unit_test::basic_cstring<char_const>::null;
    local_650 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_17.m_end = pvVar8;
    msg_17.m_begin = pvVar6;
    file_17.m_end = (iterator)0x6a;
    file_17.m_begin = (iterator)&local_648;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_658,
               msg_17);
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_668 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_660 = "";
    pbVar14 = &res_bool;
    pvVar6 = (iterator)0x2;
    pbVar11 = &isInReindexing;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&lastblock_hash,&local_668,0x6a,1,2,pbVar11,"isInReindexing",pbVar14,"res_bool");
    key_lastblockhash_uxto = 'B';
    RandomMixin<FastRandomContext>::rand256
              (&lastblock_hash,&this_00->super_RandomMixin<FastRandomContext>);
    local_680 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_678 = "";
    local_690 = &boost::unit_test::basic_cstring<char_const>::null;
    local_688 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_18.m_end = pbVar11;
    msg_18.m_begin = pvVar6;
    file_18.m_end = (iterator)0x6f;
    file_18.m_begin = (iterator)&local_680;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_690,
               msg_18);
    bVar3 = CDBWrapper::Write<unsigned_char,uint256>
                      (&dbw,&key_lastblockhash_uxto,&lastblock_hash,false);
    filename._M_dataplus._M_p._0_1_ = bVar3;
    filename._M_string_length = 0;
    filename.field_2._M_allocated_capacity = 0;
    key_file_option._M_dataplus._M_p = "dbw.Write(key_lastblockhash_uxto, lastblock_hash)";
    key_file_option._M_string_length =
         (long)"dbw.Write(key_lastblockhash_uxto, lastblock_hash)" + 0x31;
    file_option_tag._M_string_length = file_option_tag._M_string_length & 0xffffffffffffff00;
    file_option_tag._M_dataplus._M_p = "<W\x1b";
    file_option_tag.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    file_option_tag.field_2._8_8_ = &key_file_option;
    local_6a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_698 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&filename,(lazy_ostream *)&file_option_tag,1,0,WARN,
               (check_type)pbVar14,(size_t)&local_6a0,0x6f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&filename.field_2._M_allocated_capacity);
    local_6b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_6a8 = "";
    local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_19.m_end = pvVar8;
    msg_19.m_begin = pvVar6;
    file_19.m_end = (iterator)0x70;
    file_19.m_begin = (iterator)&local_6b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_6c0,
               msg_19);
    bVar3 = CDBWrapper::Read<unsigned_char,uint256>(&dbw,&key_lastblockhash_uxto,&res);
    filename._M_dataplus._M_p._0_1_ = bVar3;
    filename._M_string_length = 0;
    filename.field_2._M_allocated_capacity = 0;
    key_file_option._M_dataplus._M_p = "dbw.Read(key_lastblockhash_uxto, res)";
    key_file_option._M_string_length = (long)"dbw.Read(key_lastblockhash_uxto, res)" + 0x25;
    file_option_tag._M_string_length = file_option_tag._M_string_length & 0xffffffffffffff00;
    file_option_tag._M_dataplus._M_p = "<W\x1b";
    file_option_tag.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    file_option_tag.field_2._8_8_ = &key_file_option;
    local_6d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_6c8 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&filename,(lazy_ostream *)&file_option_tag,1,0,WARN,
               (check_type)pbVar14,(size_t)&local_6d0,0x70);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&filename.field_2._M_allocated_capacity);
    local_6e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_6d8 = "";
    local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_20.m_end = pvVar8;
    msg_20.m_begin = pvVar6;
    file_20.m_end = (iterator)0x71;
    file_20.m_begin = (iterator)&local_6e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_6f0,
               msg_20);
    file_option_tag._M_string_length = file_option_tag._M_string_length & 0xffffffffffffff00;
    file_option_tag._M_dataplus._M_p = "<W\x1b";
    file_option_tag.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    file_option_tag.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_700 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_6f8 = "";
    puVar15 = &res;
    args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lastblock_hash;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (&file_option_tag,&local_700,0x71,1,2,args_2,"lastblock_hash",puVar15,"res");
    psVar7 = &filename;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file_option_tag,"F",(allocator<char> *)psVar7);
    uVar4 = RandomMixin<FastRandomContext>::randbits
                      (&this_00->super_RandomMixin<FastRandomContext>,8);
    filename_length = (uint8_t)uVar4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)psVar7,"randomfilename",(allocator<char> *)&key_file_option);
    tinyformat::format<std::__cxx11::string,unsigned_char,std::__cxx11::string>
              (&key_file_option,(tinyformat *)"%s%01x%s",(char *)&file_option_tag,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filename_length
               ,(uchar *)psVar7,args_2);
    in_file_bool = RandomMixin<FastRandomContext>::randbool
                             (&this_00->super_RandomMixin<FastRandomContext>);
    local_718 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_710 = "";
    local_728 = &boost::unit_test::basic_cstring<char_const>::null;
    local_720 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_21.m_end = (iterator)args_2;
    msg_21.m_begin = (iterator)psVar7;
    file_21.m_end = (iterator)0x7a;
    file_21.m_begin = (iterator)&local_718;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_728,
               msg_21);
    local_740.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         CDBWrapper::Write<std::__cxx11::string,bool>(&dbw,&key_file_option,&in_file_bool,false);
    local_740.m_message.px = (element_type *)0x0;
    local_740.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_770 = "dbw.Write(key_file_option, in_file_bool)";
    local_768 = "";
    local_760.m_empty = false;
    local_760._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_750 = boost::unit_test::lazy_ostream::inst;
    local_748 = &local_770;
    local_780 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_778 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_740,&local_760,1,0,WARN,(check_type)puVar15,(size_t)&local_780,0x7a);
    boost::detail::shared_count::~shared_count(&local_740.m_message.pn);
    local_790 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_788 = "";
    local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_798 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_22.m_end = pvVar8;
    msg_22.m_begin = pvVar6;
    file_22.m_end = (iterator)0x7b;
    file_22.m_begin = (iterator)&local_790;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_7a0,
               msg_22);
    local_740.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         CDBWrapper::Read<std::__cxx11::string,bool>(&dbw,&key_file_option,&res_bool);
    local_740.m_message.px = (element_type *)0x0;
    local_740.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_770 = "dbw.Read(key_file_option, res_bool)";
    local_768 = "";
    local_760.m_empty = false;
    local_760._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_750 = boost::unit_test::lazy_ostream::inst;
    local_748 = &local_770;
    local_7b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_7a8 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_740,&local_760,1,0,WARN,(check_type)puVar15,(size_t)&local_7b0,0x7b);
    boost::detail::shared_count::~shared_count(&local_740.m_message.pn);
    local_7c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_7b8 = "";
    local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_23.m_end = pvVar8;
    msg_23.m_begin = pvVar6;
    file_23.m_end = (iterator)0x7c;
    file_23.m_begin = (iterator)&local_7c0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_7d0,
               msg_23);
    local_760.m_empty = false;
    local_760._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_750 = boost::unit_test::lazy_ostream::inst;
    local_748 = (char **)0xc694e1;
    local_7e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_7d8 = "";
    in_stack_fffffffffffff7f0 = &in_file_bool;
    in_R8 = (iterator)0x2;
    in_R9 = &res_bool;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_760,&local_7e0,0x7c,1,2,in_R9,"res_bool",in_stack_fffffffffffff7f0,
               "in_file_bool");
    std::__cxx11::string::~string((string *)&key_file_option);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&file_option_tag);
    std::__cxx11::string::~string((string *)&key_utxo);
    std::__cxx11::string::~string((string *)&key_transaction);
    std::__cxx11::string::~string((string *)&key_file);
    std::__cxx11::string::~string((string *)&key_block);
    CDBWrapper::~CDBWrapper(&dbw);
    std::filesystem::__cxx11::path::~path(&ph.super_path);
    lVar5 = lVar5 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(dbwrapper_basic_data)
{
    // Perform tests both obfuscated and non-obfuscated.
    for (bool obfuscate : {false, true}) {
        fs::path ph = m_args.GetDataDirBase() / (obfuscate ? "dbwrapper_1_obfuscate_true" : "dbwrapper_1_obfuscate_false");
        CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20, .memory_only = false, .wipe_data = true, .obfuscate = obfuscate});

        uint256 res;
        uint32_t res_uint_32;
        bool res_bool;

        // Ensure that we're doing real obfuscation when obfuscate=true
        BOOST_CHECK(obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw)));

        //Simulate block raw data - "b + block hash"
        std::string key_block = "b" + m_rng.rand256().ToString();

        uint256 in_block = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_block, in_block));
        BOOST_CHECK(dbw.Read(key_block, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_block.ToString());

        //Simulate file raw data - "f + file_number"
        std::string key_file = strprintf("f%04x", m_rng.rand32());

        uint256 in_file_info = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_file, in_file_info));
        BOOST_CHECK(dbw.Read(key_file, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_file_info.ToString());

        //Simulate transaction raw data - "t + transaction hash"
        std::string key_transaction = "t" + m_rng.rand256().ToString();

        uint256 in_transaction = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_transaction, in_transaction));
        BOOST_CHECK(dbw.Read(key_transaction, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_transaction.ToString());

        //Simulate UTXO raw data - "c + transaction hash"
        std::string key_utxo = "c" + m_rng.rand256().ToString();

        uint256 in_utxo = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_utxo, in_utxo));
        BOOST_CHECK(dbw.Read(key_utxo, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_utxo.ToString());

        //Simulate last block file number - "l"
        uint8_t key_last_blockfile_number{'l'};
        uint32_t lastblockfilenumber = m_rng.rand32();
        BOOST_CHECK(dbw.Write(key_last_blockfile_number, lastblockfilenumber));
        BOOST_CHECK(dbw.Read(key_last_blockfile_number, res_uint_32));
        BOOST_CHECK_EQUAL(lastblockfilenumber, res_uint_32);

        //Simulate Is Reindexing - "R"
        uint8_t key_IsReindexing{'R'};
        bool isInReindexing = m_rng.randbool();
        BOOST_CHECK(dbw.Write(key_IsReindexing, isInReindexing));
        BOOST_CHECK(dbw.Read(key_IsReindexing, res_bool));
        BOOST_CHECK_EQUAL(isInReindexing, res_bool);

        //Simulate last block hash up to which UXTO covers - 'B'
        uint8_t key_lastblockhash_uxto{'B'};
        uint256 lastblock_hash = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_lastblockhash_uxto, lastblock_hash));
        BOOST_CHECK(dbw.Read(key_lastblockhash_uxto, res));
        BOOST_CHECK_EQUAL(lastblock_hash, res);

        //Simulate file raw data - "F + filename_number + filename"
        std::string file_option_tag = "F";
        uint8_t filename_length = m_rng.randbits(8);
        std::string filename = "randomfilename";
        std::string key_file_option = strprintf("%s%01x%s", file_option_tag,filename_length,filename);

        bool in_file_bool = m_rng.randbool();
        BOOST_CHECK(dbw.Write(key_file_option, in_file_bool));
        BOOST_CHECK(dbw.Read(key_file_option, res_bool));
        BOOST_CHECK_EQUAL(res_bool, in_file_bool);
   }
}